

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::Preprocessor::preprocessEq(Preprocessor *this,uint32 maxIters)

{
  int iVar1;
  PrgHead **ppPVar2;
  bool bVar3;
  Atom_t AVar4;
  uint32 uVar5;
  size_type ns;
  HeadIter ppPVar6;
  SharedContext *this_00;
  SharedContext *pSVar7;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  VarVec *unaff_retaddr;
  bool in_stack_0000000f;
  HeadRange *in_stack_00000010;
  Preprocessor *in_stack_00000018;
  VarVec *supported;
  HeadIter end_1;
  HeadIter it_1;
  HeadIter end;
  HeadIter it;
  HeadRange atoms;
  ValueRep res;
  uint32 startVar;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  LogicProgram *this_01;
  undefined4 in_stack_ffffffffffffff88;
  pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
  *in_stack_ffffffffffffff90;
  HeadIter local_50;
  BodyExtra local_44;
  HeadIter local_40;
  HeadIter local_38;
  pair<Clasp::Asp::PrgHead_*const_*,_Clasp::Asp::PrgHead_*const_*> local_30;
  ValueRep local_19;
  uint32 local_18;
  undefined4 local_14;
  
  local_14 = in_ESI;
  ProgramBuilder::ctx((ProgramBuilder *)*in_RDI);
  local_18 = SharedContext::numVars((SharedContext *)0x224b83);
  local_19 = '\x01';
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = local_14;
  ppPVar6 = LogicProgram::atom_begin((LogicProgram *)0x224bb2);
  AVar4 = LogicProgram::startAtom((LogicProgram *)*in_RDI);
  local_38 = ppPVar6 + AVar4;
  local_40 = LogicProgram::atom_end
                       ((LogicProgram *)
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::pair<Clasp::Asp::PrgHead_*const_*,_Clasp::Asp::PrgHead_*const_*>::
  pair<Clasp::Asp::PrgHead_*const_*,_Clasp::Asp::PrgHead_*const_*,_true>
            (&local_30,&local_38,&local_40);
  this_01 = (LogicProgram *)(in_RDI + 3);
  uVar5 = LogicProgram::numBodies((LogicProgram *)0x224c1b);
  ns = uVar5 + 1;
  BodyExtra::BodyExtra(&local_44);
  bk_lib::
  pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
  ::resize(in_stack_ffffffffffffff90,ns,(BodyExtra *)this_01);
  while( true ) {
    iVar1 = *(int *)(in_RDI + 7);
    *(uint *)(in_RDI + 7) = iVar1 + 1U;
    if (1 < iVar1 + 1U) {
      local_50 = LogicProgram::atom_begin((LogicProgram *)0x224c63);
      ppPVar2 = local_30.second;
      while (local_50 != ppPVar2) {
        for (; local_50 != local_30.first; local_50 = local_50 + 1) {
          PrgHead::setInUpper(*local_50,false);
        }
        for (; local_50 != ppPVar2; local_50 = local_50 + 1) {
          PrgNode::clearLiteral(&(*local_50)->super_PrgNode,false);
          PrgHead::setInUpper(*local_50,false);
        }
      }
      this_00 = (SharedContext *)
                LogicProgram::disj_begin
                          ((LogicProgram *)
                           CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      pSVar7 = (SharedContext *)
               LogicProgram::disj_end
                         ((LogicProgram *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      for (; this_00 != pSVar7; this_00 = (SharedContext *)&this_00->sccGraph) {
        PrgNode::clearLiteral((PrgNode *)(this_00->satPrepro).ptr_,false);
        PrgHead::setInUpper((PrgHead *)(this_00->satPrepro).ptr_,false);
      }
      ProgramBuilder::ctx((ProgramBuilder *)*in_RDI);
      uVar5 = (uint32)((ulong)pSVar7 >> 0x20);
      ProgramBuilder::ctx((ProgramBuilder *)*in_RDI);
      SharedContext::numVars((SharedContext *)0x224d77);
      SharedContext::popVars(this_00,uVar5);
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5));
    }
    LogicProgram::getSupportedBodies(this_01,SUB81((ulong)in_RDI >> 0x38,0));
    bVar3 = classifyProgram((Preprocessor *)CONCAT44(ns,in_stack_ffffffffffffff88),(VarVec *)this_01
                           );
    if (!bVar3) break;
    local_19 = simplifyClassifiedProgram
                         (in_stack_00000018,in_stack_00000010,in_stack_0000000f,unaff_retaddr);
    in_stack_ffffffffffffff67 = false;
    if (local_19 == '\0') {
      in_stack_ffffffffffffff67 = *(int *)(in_RDI + 7) != *(int *)((long)in_RDI + 0x3c);
    }
    if ((bool)in_stack_ffffffffffffff67 == false) {
      return local_19 != '\x02';
    }
  }
  return false;
}

Assistant:

bool Preprocessor::preprocessEq(uint32 maxIters) {
	uint32 startVar = prg_->ctx()->numVars();
	ValueRep res    = value_true;
	pass_           = 0;
	maxPass_        = maxIters;
	HeadRange atoms = HeadRange(prg_->atom_begin() + prg_->startAtom(), prg_->atom_end());
	bodyInfo_.resize( prg_->numBodies() + 1 );
	do {
		if (++pass_ > 1) {
			for (HeadIter it = prg_->atom_begin(), end = atoms.second; it != end; ) {
				while (it != atoms.first){ (*it)->setInUpper(false); ++it; }
				while (it != end)        { (*it)->clearLiteral(false); (*it)->setInUpper(false); ++it; }
			}
			for (HeadIter it = prg_->disj_begin(), end = prg_->disj_end(); it != end; ++it) {
				(*it)->clearLiteral(false);
				(*it)->setInUpper(false);
			}
			prg_->ctx()->popVars(prg_->ctx()->numVars() - startVar);
			litToNode_.clear();
		}
		VarVec& supported = prg_->getSupportedBodies(true);
		if (!classifyProgram(supported)) { return false; }
		res = simplifyClassifiedProgram(atoms, pass_ != maxPass_, supported);
	} while (res == value_free && pass_ != maxPass_);
	return res != value_false;
}